

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O2

int TVMModLoadFromFile(char *file_name,char *format,TVMModuleHandle *out)

{
  __shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> *this;
  allocator<char> local_62;
  allocator<char> local_61;
  Module m;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,file_name,&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,format,&local_62);
  tvm::runtime::Module::LoadFromFile(&m,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  this = (__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> *)operator_new(0x10);
  std::__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (this,(__shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2> *)&m);
  *out = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return 0;
}

Assistant:

int TVMModLoadFromFile(const char *file_name,
                       const char *format,
                       TVMModuleHandle *out) {
  API_BEGIN();
  Module m = Module::LoadFromFile(file_name, format);
  *out = new Module(m);
  API_END();
}